

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O2

cl_int clMemFreeINTEL_EMU(cl_context context,void *ptr)

{
  mutex *__mutex;
  int iVar1;
  CLIntercept *pCVar2;
  mapped_type *this;
  iterator iVar3;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_> _Var4;
  cl_int cVar5;
  key_type pvStack_30;
  cl_context p_Stack_28;
  
  pCVar2 = g_pIntercept;
  if ((g_pIntercept != (CLIntercept *)0x0) &&
     ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory == true)) {
    __mutex = &g_pIntercept->m_Mutex;
    pvStack_30 = ptr;
    p_Stack_28 = context;
    std::mutex::lock(__mutex);
    this = std::
           map<_cl_context_*,_CLIntercept::SUSMContextInfo,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SUSMContextInfo>_>_>
           ::operator[](&pCVar2->m_USMContextInfoMap,&p_Stack_28);
    iVar3 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
            ::find((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
                    *)this,&pvStack_30);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->AllocMap)._M_t._M_impl.super__Rb_tree_header) {
      cVar5 = -0x26;
    }
    else {
      iVar1 = *(int *)&iVar3._M_node[1]._M_parent;
      if (iVar1 == 0x4197) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                          ((this->HostAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->HostAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,&pvStack_30);
        std::vector<const_void_*,_std::allocator<const_void_*>_>::erase
                  (&this->HostAllocVector,(const_iterator)_Var4._M_current);
      }
      else if (iVar1 == 0x4198) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                          ((this->DeviceAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->DeviceAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,&pvStack_30);
        std::vector<const_void_*,_std::allocator<const_void_*>_>::erase
                  (&this->DeviceAllocVector,(const_iterator)_Var4._M_current);
      }
      else if (iVar1 == 0x4199) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                          ((this->SharedAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->SharedAllocVector).
                           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,&pvStack_30);
        std::vector<const_void_*,_std::allocator<const_void_*>_>::erase
                  (&this->SharedAllocVector,(const_iterator)_Var4._M_current);
      }
      std::
      _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
      ::erase((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
               *)this,&pvStack_30);
      (*(pCVar2->m_Dispatch).clSVMFree)(p_Stack_28,pvStack_30);
      pvStack_30 = (void *)0x0;
      cVar5 = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return cVar5;
  }
  return -0x3b;
}

Assistant:

cl_int CL_API_CALL clMemFreeINTEL_EMU(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedMemFree(
            context,
            ptr );
    }

    return CL_INVALID_OPERATION;
}